

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcCoveringType::~IfcCoveringType(IfcCoveringType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x8e72e8;
  *(undefined8 *)&this->field_0x30 = 0x8e7400;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8e7310;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8e7338;
  *(undefined8 *)&this[-1].field_0x138 = 0x8e7360;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8e7388;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8e73b0;
  *(undefined8 *)this = 0x8e73d8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x8e76c8;
  *(undefined8 *)&this->field_0x30 = 0x8e7790;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8e76f0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8e7718;
  *(undefined8 *)&this[-1].field_0x138 = 0x8e7740;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8e7768;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__008e7428);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcCoveringType() : Object("IfcCoveringType") {}